

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5221:24)>
::getImpl(TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5221:24)>
          *this,ExceptionOrValue *output)

{
  Exception *t;
  Exception *func;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *pEVar1;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *t_00;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *func_00;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_5f0;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_5c8;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *local_400;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *depValue;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *_depValue742;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_3c8;
  Exception *local_200;
  Exception *depException;
  Exception *_depException738;
  undefined1 local_1e0 [8];
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5221:24)>
  *this_local;
  
  depResult.value.ptr.field_1._32_8_ = output;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
            ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_1e0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1e0);
  t = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1e0);
  depException = t;
  if (t == (Exception *)0x0) {
    t_00 = readMaybe<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                     ((Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                       *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                 details.builder + 0x18));
    depValue = t_00;
    if (t_00 != (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)0x0) {
      local_400 = t_00;
      func_00 = mv<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>(t_00);
      MaybeVoidCaller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
      ::
      apply<kj::_::IdentityFunc<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
                (&local_5f0,
                 (MaybeVoidCaller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                  *)&this->field_0x20,
                 (IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                  *)func_00,t_00);
      TransformPromiseNodeBase::
      handle<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                (&local_5c8,&this->super_TransformPromiseNodeBase,&local_5f0);
      pEVar1 = ExceptionOrValue::
               as<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
      ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
                (pEVar1,&local_5c8);
      ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
      ~ExceptionOr(&local_5c8);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_5f0);
    }
  }
  else {
    local_200 = t;
    func = mv<kj::Exception>(t);
    MaybeVoidCaller<kj::Exception,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
    ::apply<kj::(anonymous_namespace)::TestCase5164::run()::__6>
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&_depValue742,
               (MaybeVoidCaller<kj::Exception,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                *)&this->field_0x21,(Type *)func,t);
    TransformPromiseNodeBase::
    handle<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              (&local_3c8,&this->super_TransformPromiseNodeBase,
               (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&_depValue742);
    pEVar1 = ExceptionOrValue::
             as<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              (pEVar1,&local_3c8);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ExceptionOr(&local_3c8);
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&_depValue742);
  }
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~ExceptionOr
            ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_1e0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }